

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

void test_fun_obj(void)

{
  test_context context;
  test_context context_00;
  test_context context_01;
  test_context context_02;
  test_context context_03;
  test_context context_04;
  test_context context_05;
  test_context context_06;
  test_context context_07;
  test_context context_08;
  test_context context_09;
  test_context context_10;
  test_context context_11;
  test_context context_12;
  test_context context_13;
  test_context context_14;
  test_context context_15;
  test_context context_16;
  test_context context_17;
  test_context context_18;
  test_context context_19;
  test_context context_20;
  test_context context_21;
  test_context context_22;
  test_context context_23;
  test_context context_24;
  test_context context_25;
  test_context context_26;
  test_context context_27;
  test_context context_28;
  test_context context_29;
  test_context context_30;
  test_context context_31;
  test_context context_32;
  test_context context_33;
  test_context context_34;
  test_context context_35;
  test_context context_36;
  test_context context_37;
  test_context context_38;
  test_context context_39;
  test_context context_40;
  test_context context_41;
  test_context context_42;
  test_context context_43;
  test_context context_44;
  test_context context_45;
  int iVar1;
  value_type local_248;
  _func_int_int *f;
  undefined4 uStack_228;
  undefined4 uStack_224;
  char *local_220;
  undefined4 local_214;
  value_type local_210;
  char *local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  char *local_1e8;
  char *local_1e0;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  char *local_1d0;
  char *local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  char *local_1b8;
  char *local_1b0;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  char *local_1a0;
  char *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  char *local_188;
  char *local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  char *local_170;
  char *local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  char *local_158;
  char *local_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  char *local_140;
  char *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  char *local_128;
  char *local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  char *local_110;
  char *local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  char *local_f8;
  char *local_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  char *local_e0;
  char *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  char *local_c8;
  char *local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  char *local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  char *local_98;
  char *local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  char *local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  char *local_68;
  char *local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  char *local_50;
  char *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x1ec;
  local_210.expr = "test_invoke_fun(f(40), nothrows, f, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context._12_4_ = uStack_224;
  context.line = 0x98;
  context.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_00._12_4_ = local_248._12_4_;
  context_00.line = 0x8c;
  context_00.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_00.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_00);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_48 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_40 = 0x1ed;
  local_38 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  context_01._12_4_ = uStack_3c;
  context_01.line = 0x1ed;
  context_01.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_01.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  test_check(true,context_01);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x1ee;
  local_248.expr = "test_not_invocable(cf, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x1ef;
  local_210.expr = "test_invoke_fun(std::move(f)(40), nothrows, std::move(f), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_02._12_4_ = uStack_224;
  context_02.line = 0x98;
  context_02.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_02.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_02);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_03._12_4_ = local_248._12_4_;
  context_03.line = 0x8c;
  context_03.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_03.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_03);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_58 = 0x1f0;
  local_50 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(f), 40))";
  context_04._12_4_ = uStack_54;
  context_04.line = 0x1f0;
  context_04.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_04.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(f), 40))";
  test_check(true,context_04);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x1f1;
  local_248.expr = "test_not_invocable(std::move(cf), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 499;
  local_248.expr = "test_not_invocable(f)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 500;
  local_248.expr = "test_not_invocable(f, 40, 41)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x1f5;
  local_248.expr = "test_not_invocable_r<int*>(f, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 1;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x201;
  local_210.expr = "test_invoke_fun(fc(40), nothrows, fc, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_05._12_4_ = uStack_224;
  context_05.line = 0x98;
  context_05.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_05.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_05);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_06._12_4_ = local_248._12_4_;
  context_06.line = 0x8c;
  context_06.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_06.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_06);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_78 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_70 = 0x202;
  local_68 = "PP_UNIQUE(constexpr) == (eggs::invoke(fc, 40))";
  context_07._12_4_ = uStack_6c;
  context_07.line = 0x202;
  context_07.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_07.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(fc, 40))";
  test_check(true,context_07);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x203;
  local_210.expr = "test_invoke_fun(cfc(40), nothrows, cfc, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_08._12_4_ = uStack_224;
  context_08.line = 0x98;
  context_08.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_08.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_08);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_09._12_4_ = local_248._12_4_;
  context_09.line = 0x8c;
  context_09.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_09.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_09);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_88 = 0x204;
  local_80 = "PP_UNIQUE(constexpr) == (eggs::invoke(cfc, 40))";
  context_10._12_4_ = uStack_84;
  context_10.line = 0x204;
  context_10.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_10.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(cfc, 40))";
  test_check(true,context_10);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x205;
  local_210.expr = "test_invoke_fun(std::move(fc)(40), nothrows, std::move(fc), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_11._12_4_ = uStack_224;
  context_11.line = 0x98;
  context_11.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_11.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_11);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_12._12_4_ = local_248._12_4_;
  context_12.line = 0x8c;
  context_12.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_12.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_12);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_a8 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_a0 = 0x206;
  local_98 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fc), 40))";
  context_13._12_4_ = uStack_9c;
  context_13.line = 0x206;
  context_13.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_13.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fc), 40))";
  test_check(true,context_13);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x207;
  local_210.expr = "test_invoke_fun(std::move(cfc)(40), nothrows, std::move(cfc), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_14._12_4_ = uStack_224;
  context_14.line = 0x98;
  context_14.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_14.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_14);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_15._12_4_ = local_248._12_4_;
  context_15.line = 0x8c;
  context_15.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_15.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_15);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_b8 = 0x208;
  local_b0 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfc), 40))";
  context_16._12_4_ = uStack_b4;
  context_16.line = 0x208;
  context_16.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_16.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfc), 40))";
  test_check(true,context_16);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x214;
  local_210.expr = "test_invoke_fun(fl(40), nothrows, fl, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_17._12_4_ = uStack_224;
  context_17.line = 0x98;
  context_17.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_17.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_17);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_18._12_4_ = local_248._12_4_;
  context_18.line = 0x8c;
  context_18.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_18.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_18);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_d8 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_d0 = 0x215;
  local_c8 = "PP_UNIQUE(constexpr) == (eggs::invoke(fl, 40))";
  context_19._12_4_ = uStack_cc;
  context_19.line = 0x215;
  context_19.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_19.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(fl, 40))";
  test_check(true,context_19);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x216;
  local_248.expr = "test_not_invocable(cfl, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x217;
  local_248.expr = "test_not_invocable(std::move(fl), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x218;
  local_248.expr = "test_not_invocable(std::move(cfl), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x224;
  local_248.expr = "test_not_invocable(fr, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x225;
  local_248.expr = "test_not_invocable(cfr, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x226;
  local_210.expr = "test_invoke_fun(std::move(fr)(40), nothrows, std::move(fr), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_20._12_4_ = uStack_224;
  context_20.line = 0x98;
  context_20.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_20.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_20);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_21._12_4_ = local_248._12_4_;
  context_21.line = 0x8c;
  context_21.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_21.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_21);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_f0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_e8 = 0x227;
  local_e0 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fr), 40))";
  context_22._12_4_ = uStack_e4;
  context_22.line = 0x227;
  context_22.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_22.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fr), 40))";
  test_check(true,context_22);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x228;
  local_248.expr = "test_not_invocable(std::move(cfr), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x234;
  local_210.expr = "test_invoke_fun(fcl(40), nothrows, fcl, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_23._12_4_ = uStack_224;
  context_23.line = 0x98;
  context_23.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_23.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_23);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_24._12_4_ = local_248._12_4_;
  context_24.line = 0x8c;
  context_24.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_24.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_24);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_108 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_100 = 0x235;
  local_f8 = "PP_UNIQUE(constexpr) == (eggs::invoke(fcl, 40))";
  context_25._12_4_ = uStack_fc;
  context_25.line = 0x235;
  context_25.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_25.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(fcl, 40))";
  test_check(true,context_25);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x236;
  local_210.expr = "test_invoke_fun(cfcl(40), nothrows, cfcl, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_26._12_4_ = uStack_224;
  context_26.line = 0x98;
  context_26.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_26.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_26);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_27._12_4_ = local_248._12_4_;
  context_27.line = 0x8c;
  context_27.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_27.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_27);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_120 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_118 = 0x237;
  local_110 = "PP_UNIQUE(constexpr) == (eggs::invoke(cfcl, 40))";
  context_28._12_4_ = uStack_114;
  context_28.line = 0x237;
  context_28.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_28.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(cfcl, 40))";
  test_check(true,context_28);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x238;
  local_210.expr = "test_invoke_fun(std::move(fcl)(40), nothrows, std::move(fcl), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_29._12_4_ = uStack_224;
  context_29.line = 0x98;
  context_29.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_29.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_29);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_30._12_4_ = local_248._12_4_;
  context_30.line = 0x8c;
  context_30.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_30.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_30);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_138 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_130 = 0x239;
  local_128 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcl), 40))";
  context_31._12_4_ = uStack_12c;
  context_31.line = 0x239;
  context_31.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_31.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcl), 40))";
  test_check(true,context_31);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x23a;
  local_210.expr = "test_invoke_fun(std::move(cfcl)(40), nothrows, std::move(cfcl), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_32._12_4_ = uStack_224;
  context_32.line = 0x98;
  context_32.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_32.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_32);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_33._12_4_ = local_248._12_4_;
  context_33.line = 0x8c;
  context_33.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_33.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_33);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_150 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_148 = 0x23b;
  local_140 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfcl), 40))";
  context_34._12_4_ = uStack_144;
  context_34.line = 0x23b;
  context_34.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_34.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfcl), 40))";
  test_check(true,context_34);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x247;
  local_248.expr = "test_not_invocable(fcr, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x248;
  local_248.expr = "test_not_invocable(cfcr, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x249;
  local_210.expr = "test_invoke_fun(std::move(fcr)(40), nothrows, std::move(fcr), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_35._12_4_ = uStack_224;
  context_35.line = 0x98;
  context_35.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_35.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_35);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_36._12_4_ = local_248._12_4_;
  context_36.line = 0x8c;
  context_36.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_36.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_36);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_168 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_160 = 0x24a;
  local_158 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcr), 40))";
  context_37._12_4_ = uStack_15c;
  context_37.line = 0x24a;
  context_37.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_37.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(fcr), 40))";
  test_check(true,context_37);
  local_210.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_210.line = 0x24b;
  local_210.expr = "test_invoke_fun(std::move(cfcr)(40), nothrows, std::move(cfcr), 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_210);
  f = (_func_int_int *)anon_var_dwarf_2931;
  uStack_228 = 0x98;
  local_220 = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_38._12_4_ = uStack_224;
  context_38.line = 0x98;
  context_38.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_38.expr = "eggs::invoke(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_38);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x8c;
  local_248.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  context_39._12_4_ = local_248._12_4_;
  context_39.line = 0x8c;
  context_39.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_39.expr = "eggs::invoke_r<R>(std::forward<F>(f), std::forward<Args>(args)...) == r";
  test_check(true,context_39);
  test_report_info<void>::checks = test_report_info<void>::checks + 4;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_180 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_178 = 0x24c;
  local_170 = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfcr), 40))";
  context_40._12_4_ = uStack_174;
  context_40.line = 0x24c;
  context_40.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_40.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(std::move(cfcr), 40))";
  test_check(true,context_40);
  f = test_fun_obj::S::f;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x259;
  local_248.expr = "test_invoke_fun(f(40), p0012_nothrows, f, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  local_210.file._0_4_ = 0x2e;
  local_214 = 0x28;
  test_invoke_fun<int,true,int(*const&)(int)noexcept,int>(&local_210,&f);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar1 = (*f)(0x28);
  local_198 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_190 = 0x25a;
  local_188 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  context_41._12_4_ = uStack_18c;
  context_41.line = 0x25a;
  context_41.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_41.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, 40))";
  test_check(iVar1 == 0x2e,context_41);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x25c;
  local_248.expr = "test_invoke_fun(f(conv_to<int>{40}), p0012_nothrows, f, conv_to<int>{40})";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  local_210.file._0_4_ = 0x2e;
  local_214 = 0x28;
  test_invoke_fun<int,true,int(*const&)(int)noexcept,conv_to<int,true>>(&local_210,&f);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar1 = (*f)(0x28);
  local_1b0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_1a8 = 0x25d;
  local_1a0 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to<int>{40}))";
  context_42._12_4_ = uStack_1a4;
  context_42.line = 0x25d;
  context_42.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_42.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to<int>{40}))";
  test_check(iVar1 == 0x2e,context_42);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x25e;
  local_248.expr = "test_invoke_fun(f(conv_to_throws<int>{40}), throws, f, conv_to_throws<int>{40})"
  ;
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  local_210.file._0_4_ = 0x2e;
  local_214 = 0x28;
  test_invoke_fun<int,false,int(*const&)(int)noexcept,conv_to<int,false>>(&local_210,&f);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar1 = (*f)(0x28);
  local_1c8 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_1c0 = 0x25f;
  local_1b8 = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to_throws<int>{40}))";
  context_43._12_4_ = uStack_1bc;
  context_43.line = 0x25f;
  context_43.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_43.expr = "PP_UNIQUE(constexpr) == (eggs::invoke(f, conv_to_throws<int>{40}))";
  test_check(iVar1 == 0x2e,context_43);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x260;
  local_248.expr = "test_invoke_r_fun<conv_from<int>>(f(40), p0012_nothrows, p0012_nothrows, f, 40)"
  ;
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  local_210.file._0_4_ = 0x2e;
  local_214 = 0x28;
  test_invoke_r_fun<conv_from<int,true>,true,true,int(*const&)(int)noexcept,int>(&local_210,&f);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar1 = (*f)(0x28);
  local_1e0 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_1d8 = 0x261;
  local_1d0 = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from<int>>(f, 40))";
  context_44._12_4_ = uStack_1d4;
  context_44.line = 0x261;
  context_44.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_44.expr = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from<int>>(f, 40))";
  test_check(iVar1 == 0x2e,context_44);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x262;
  local_248.expr = "test_invoke_r_fun<conv_from_throws<int>>(f(40), p0012_nothrows, throws, f, 40)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  local_210.file = (char *)CONCAT44(local_210.file._4_4_,0x2e);
  local_214 = 0x28;
  test_invoke_r_fun<conv_from<int,false>,true,false,int(*const&)(int)noexcept,int>(&local_210,&f);
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  iVar1 = (*f)(0x28);
  local_1f8 = "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  uStack_1f0 = 0x263;
  local_1e8 = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from_throws<int>>(f, 40))";
  context_45._12_4_ = uStack_1ec;
  context_45.line = 0x263;
  context_45.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_45.expr = "PP_UNIQUE(constexpr) == (eggs::invoke_r<conv_from_throws<int>>(f, 40))";
  test_check(iVar1 == 0x2e,context_45);
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x265;
  local_248.expr = "test_not_invocable(f)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  local_248.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  local_248.line = 0x266;
  local_248.expr = "test_not_invocable(f, 40, 41)";
  std::deque<test_context,_std::allocator<test_context>_>::push_front
            (&test_scope_stack<void>::stack,&local_248);
  test_report_info<void>::checks = test_report_info<void>::checks + 2;
  std::deque<test_context,_std::allocator<test_context>_>::pop_front(&test_scope_stack<void>::stack)
  ;
  return;
}

Assistant:

void test_fun_obj()
{
    /* call-op */ {
        struct Fn
        {
            constexpr14 int operator()(int base) noexcept
            {
                return base + 0;
            }
        };
        auto f = Fn{};
        constexpr auto cf = Fn{};

        CHECK_SCOPE(test_invoke_fun(f(40), nothrows, f, 40));
        CHECK_CONSTEXPR14(eggs::invoke(f, 40));
        CHECK_SCOPE(test_not_invocable(cf, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(f)(40), nothrows, std::move(f), 40));
        CHECK_CONSTEXPR14(eggs::invoke(std::move(f), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cf), 40));

        CHECK_SCOPE(test_not_invocable(f));
        CHECK_SCOPE(test_not_invocable(f, 40, 41));
        CHECK_SCOPE(test_not_invocable_r<int*>(f, 40));

        struct Fnc
        {
            constexpr int operator()(int base) const noexcept
            {
                return base + 1;
            }
        };
        auto fc = Fnc{};
        constexpr auto cfc = Fnc{};

        CHECK_SCOPE(test_invoke_fun(fc(40), nothrows, fc, 40));
        CHECK_CONSTEXPR(eggs::invoke(fc, 40));
        CHECK_SCOPE(test_invoke_fun(cfc(40), nothrows, cfc, 40));
        CHECK_CONSTEXPR(eggs::invoke(cfc, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fc)(40), nothrows, std::move(fc), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fc), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfc)(40), nothrows, std::move(cfc), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfc), 40));

        struct Fnl
        {
            constexpr14 int operator()(int base) & noexcept
            {
                return base + 2;
            }
        };
        auto fl = Fnl{};
        constexpr auto cfl = Fnl{};

        CHECK_SCOPE(test_invoke_fun(fl(40), nothrows, fl, 40));
        CHECK_CONSTEXPR14(eggs::invoke(fl, 40));
        CHECK_SCOPE(test_not_invocable(cfl, 40));
        CHECK_SCOPE(test_not_invocable(std::move(fl), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cfl), 40));

        struct Fnr
        {
            constexpr14 int operator()(int base) && noexcept
            {
                return base + 3;
            }
        };
        auto fr = Fnr{};
        constexpr auto cfr = Fnr{};

        CHECK_SCOPE(test_not_invocable(fr, 40));
        CHECK_SCOPE(test_not_invocable(cfr, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fr)(40), nothrows, std::move(fr), 40));
        CHECK_CONSTEXPR14(eggs::invoke(std::move(fr), 40));
        CHECK_SCOPE(test_not_invocable(std::move(cfr), 40));

        struct Fncl
        {
            constexpr int operator()(int base) const& noexcept
            {
                return base + 4;
            }
        };
        auto fcl = Fncl{};
        constexpr auto cfcl = Fncl{};

        CHECK_SCOPE(test_invoke_fun(fcl(40), nothrows, fcl, 40));
        CHECK_CONSTEXPR(eggs::invoke(fcl, 40));
        CHECK_SCOPE(test_invoke_fun(cfcl(40), nothrows, cfcl, 40));
        CHECK_CONSTEXPR(eggs::invoke(cfcl, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fcl)(40), nothrows, std::move(fcl), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fcl), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfcl)(40), nothrows, std::move(cfcl), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfcl), 40));

        struct Fncr
        {
            constexpr int operator()(int base) const&& noexcept
            {
                return base + 5;
            }
        };
        auto fcr = Fncr{};
        constexpr auto cfcr = Fncr{};

        CHECK_SCOPE(test_not_invocable(fcr, 40));
        CHECK_SCOPE(test_not_invocable(cfcr, 40));
        CHECK_SCOPE(test_invoke_fun(std::move(fcr)(40), nothrows, std::move(fcr), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(fcr), 40));
        CHECK_SCOPE(test_invoke_fun(std::move(cfcr)(40), nothrows, std::move(cfcr), 40));
        CHECK_CONSTEXPR(eggs::invoke(std::move(cfcr), 40));
    }

    /* fun-ptr */ {
        struct S
        {
            static constexpr int f(int base) noexcept(p0012)
            {
                return base + 6;
            }
        };
        constexpr auto f = &S::f;

        CHECK_SCOPE(test_invoke_fun(f(40), p0012_nothrows, f, 40));
        CHECK_CONSTEXPR(eggs::invoke(f, 40));

        CHECK_SCOPE(test_invoke_fun(f(conv_to<int>{40}), p0012_nothrows, f, conv_to<int>{40}));
        CHECK_CONSTEXPR(eggs::invoke(f, conv_to<int>{40}));
        CHECK_SCOPE(test_invoke_fun(f(conv_to_throws<int>{40}), throws, f, conv_to_throws<int>{40}));
        CHECK_CONSTEXPR(eggs::invoke(f, conv_to_throws<int>{40}));
        CHECK_SCOPE(test_invoke_r_fun<conv_from<int>>(f(40), p0012_nothrows, p0012_nothrows, f, 40));
        CHECK_CONSTEXPR(eggs::invoke_r<conv_from<int>>(f, 40));
        CHECK_SCOPE(test_invoke_r_fun<conv_from_throws<int>>(f(40), p0012_nothrows, throws, f, 40));
        CHECK_CONSTEXPR(eggs::invoke_r<conv_from_throws<int>>(f, 40));

        CHECK_SCOPE(test_not_invocable(f));
        CHECK_SCOPE(test_not_invocable(f, 40, 41));
    }
}